

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_MNSV_SameResolutionFromTwoAliasesCollapses_Test::TestBody
          (InterpreterTestSuite_MNSV_SameResolutionFromTwoAliasesCollapses_Test *this)

{
  Registry *this_00;
  bool bVar1;
  char *expected_predicate_value;
  char *pcVar2;
  Status local_452;
  allocator local_451;
  allocator local_450;
  allocator local_44f;
  allocator local_44e;
  allocator local_44d;
  allocator local_44c;
  allocator local_44b;
  allocator local_44a;
  Status local_449;
  AssertionResult gtest_ar;
  Expression expr;
  string local_418;
  AssertionResult gtest_ar_2;
  State local_3d0;
  State local_3cc;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nids;
  Expression ret;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_388;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_368;
  string local_348;
  UnixTime local_328;
  UnixTime local_320;
  string local_318;
  string local_2f8;
  AssertionResult gtest_ar_3;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  this_00 = ctx.mRegistry;
  std::__cxx11::string::string((string *)&expr,"127.0.0.1",&local_44a);
  local_368._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&ret,"1.1",&local_44b);
  ot::commissioner::BorderAgent::State::State(&local_3cc,0,0,0,0,0);
  std::__cxx11::string::string((string *)&nids,"net1",&local_44c);
  std::__cxx11::string::string((string *)&gtest_ar_2,"",&local_44d);
  std::__cxx11::string::string((string *)&local_418,"",&local_44e);
  std::__cxx11::string::string((string *)&local_348,"",&local_44f);
  local_388._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_388._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_388._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_2f8,"domain1",&local_450);
  pcVar2 = "";
  std::__cxx11::string::string((string *)&local_318,"",&local_451);
  ot::commissioner::UnixTime::UnixTime(&local_320,0);
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&gtest_ar_3,(string *)&expr,0x4e21,(ByteArray *)&local_368,
             (string *)&ret,local_3cc,(string *)&nids,1,(string *)&gtest_ar_2,&local_418,
             (Timestamp)0x0,0,&local_348,(ByteArray *)&local_388,&local_2f8,'\0',0,&local_318,
             local_320,0x103f);
  local_449 = ot::commissioner::persistent_storage::Registry::Add
                        (this_00,(BorderAgent *)&gtest_ar_3);
  local_452 = kSuccess;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            ((internal *)&gtest_ar,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",&local_449,&local_452);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&gtest_ar_3);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_388);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&nids);
  std::__cxx11::string::~string((string *)&ret);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_368);
  std::__cxx11::string::~string((string *)&expr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expr,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x1bd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&expr,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expr);
    if ((long *)CONCAT44(gtest_ar_3._4_4_,gtest_ar_3._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_3._4_4_,gtest_ar_3._0_4_) + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    std::__cxx11::string::string((string *)&expr,"127.0.0.2",&local_44a);
    local_368._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_368._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_368._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&ret,"1.1",&local_44b);
    ot::commissioner::BorderAgent::State::State(&local_3d0,0,0,0,0,0);
    std::__cxx11::string::string((string *)&nids,"net2",&local_44c);
    std::__cxx11::string::string((string *)&gtest_ar_2,"",&local_44d);
    std::__cxx11::string::string((string *)&local_418,"",&local_44e);
    std::__cxx11::string::string((string *)&local_348,"",&local_44f);
    local_388._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_388._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_388._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_2f8,"domain2",&local_450);
    pcVar2 = "";
    std::__cxx11::string::string((string *)&local_318,"",&local_451);
    ot::commissioner::UnixTime::UnixTime(&local_328,0);
    expected_predicate_value = (char *)(ulong)(uint)local_3d0;
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&gtest_ar_3,(string *)&expr,0x4e21,(ByteArray *)&local_368,
               (string *)&ret,local_3d0,(string *)&nids,2,(string *)&gtest_ar_2,&local_418,
               (Timestamp)0x0,0,&local_348,(ByteArray *)&local_388,&local_2f8,'\0',0,&local_318,
               local_328,0x103f);
    local_449 = ot::commissioner::persistent_storage::Registry::Add
                          (ctx.mRegistry,(BorderAgent *)&gtest_ar_3);
    local_452 = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              ((internal *)&gtest_ar,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
               ,"RegistryStatus::kSuccess",&local_449,&local_452);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&gtest_ar_3);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_388);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&gtest_ar_2);
    std::__cxx11::string::~string((string *)&nids);
    std::__cxx11::string::~string((string *)&ret);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_368);
    std::__cxx11::string::~string((string *)&expr);
    if (gtest_ar.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ret.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ret.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ret.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string
                ((string *)&gtest_ar_3,"start --nwk 1 net1",(allocator *)&local_418);
      ot::commissioner::Interpreter::ParseExpression
                ((Expression *)&gtest_ar_2,&ctx.mInterpreter,(string *)&gtest_ar_3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&expr,&gtest_ar_2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_2);
      std::__cxx11::string::~string((string *)&gtest_ar_3);
      ot::commissioner::Interpreter::ReParseMultiNetworkSyntax
                ((Error *)&gtest_ar_3,&ctx.mInterpreter,&expr,&ret);
      local_418._M_dataplus._M_p._0_1_ = gtest_ar_3.success_;
      local_418._M_dataplus._M_p._1_3_ = gtest_ar_3._1_3_;
      local_348._M_dataplus._M_p._0_4_ = 0;
      testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                ((internal *)&gtest_ar_2,
                 "ctx.mInterpreter.ReParseMultiNetworkSyntax(expr, ret).GetCode()",
                 "ErrorCode::kNone",(ErrorCode *)&local_418,(ErrorCode *)&local_348);
      std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
      if (gtest_ar_2.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_3);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar_2.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_418,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x1c7,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_418,(Message *)&gtest_ar_3);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_418);
        if ((long *)CONCAT44(gtest_ar_3._4_4_,gtest_ar_3._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_3._4_4_,gtest_ar_3._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_2.message_);
      ot::commissioner::Interpreter::ValidateMultiNetworkSyntax
                ((Value *)&gtest_ar_3,&ctx.mInterpreter,&ret,&nids);
      bVar1 = ot::commissioner::Interpreter::Value::HasNoError((Value *)&gtest_ar_3);
      gtest_ar_2.success_ = bVar1;
      gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_3);
      if (gtest_ar_2.success_ == false) {
        testing::Message::Message((Message *)&local_418);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_3,(internal *)&gtest_ar_2,
                   (AssertionResult *)
                   "ctx.mInterpreter.ValidateMultiNetworkSyntax(ret, nids).HasNoError()","false",
                   "true",expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_348,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x1c8,(char *)CONCAT44(gtest_ar_3._4_4_,gtest_ar_3._0_4_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)&local_418)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
        std::__cxx11::string::~string((string *)&gtest_ar_3);
        if ((long *)CONCAT44(local_418._M_dataplus._M_p._4_4_,local_418._M_dataplus._M_p._0_4_) !=
            (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_418._M_dataplus._M_p._4_4_,
                                         local_418._M_dataplus._M_p._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_2.message_);
      gtest_ar_2._0_8_ =
           (long)nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
      local_418._M_dataplus._M_p._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)&gtest_ar_3,"nids.size()","1",(unsigned_long *)&gtest_ar_2,
                 (int *)&local_418);
      if (gtest_ar_3.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_2);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_3.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar_3.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_418,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x1c9,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_418,(Message *)&gtest_ar_2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_418);
        if (gtest_ar_2._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_3.message_);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ret);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&expr);
      goto LAB_001418bc;
    }
    testing::Message::Message((Message *)&gtest_ar_3);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expr,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x1c2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&expr,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expr);
    if ((long *)CONCAT44(gtest_ar_3._4_4_,gtest_ar_3._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_3._4_4_,gtest_ar_3._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
LAB_001418bc:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, MNSV_SameResolutionFromTwoAliasesCollapses)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    Interpreter::Expression expr, ret;
    std::vector<uint64_t>   nids;
    expr = ctx.mInterpreter.ParseExpression("start --nwk 1 net1");
    EXPECT_EQ(ctx.mInterpreter.ReParseMultiNetworkSyntax(expr, ret).GetCode(), ErrorCode::kNone);
    EXPECT_TRUE(ctx.mInterpreter.ValidateMultiNetworkSyntax(ret, nids).HasNoError());
    EXPECT_EQ(nids.size(), 1);
}